

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O0

TexDictionary * rw::TexDictionary::create(void)

{
  FILE *__stream;
  char *pcVar1;
  EVP_PKEY_CTX *ctx;
  Error local_20;
  Error _e;
  TexDictionary *dict;
  
  _e = (Error)malloc_LOC((long)(int)s_plglist,0x30016,
                         "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/texture.cpp line: 113"
                        );
  if (_e == (Error)0x0) {
    local_20.plugin = 0;
    local_20.code = 0x80000002;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/texture.cpp"
            ,0x73);
    __stream = _stderr;
    pcVar1 = dbgsprint(0x80000002,(ulong)s_plglist);
    fprintf(__stream,"%s\n",pcVar1);
    setError(&local_20);
    dict = (TexDictionary *)0x0;
  }
  else {
    numAllocated = numAllocated + 1;
    ctx = (EVP_PKEY_CTX *)0x6;
    Object::init((Object *)_e,(EVP_PKEY_CTX *)0x6);
    LinkList::init((LinkList *)((long)_e + 0x10),ctx);
    LinkList::add((LinkList *)(engine + textureModuleOffset + 0x20),(LLLink *)((long)_e + 0x20));
    PluginList::construct((PluginList *)&s_plglist,(void *)_e);
    dict = (TexDictionary *)_e;
  }
  return dict;
}

Assistant:

TexDictionary*
TexDictionary::create(void)
{
	TexDictionary *dict = (TexDictionary*)rwMalloc(s_plglist.size, MEMDUR_EVENT | ID_TEXDICTIONARY);
	if(dict == nil){
		RWERROR((ERR_ALLOC, s_plglist.size));
		return nil;
	}
	numAllocated++;
	dict->object.init(TexDictionary::ID, 0);
	dict->textures.init();
	TEXTUREGLOBAL(texDicts).add(&dict->inGlobalList);
	s_plglist.construct(dict);
	return dict;
}